

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyeventhandle.cpp
# Opt level: O0

bool __thiscall KeyEventHandle::onHandleEvent(KeyEventHandle *this,Event *e)

{
  EventType EVar1;
  ostream *this_00;
  Event *e_local;
  KeyEventHandle *this_local;
  
  if (e == (Event *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    EVar1 = Event::getType(e);
    if (EVar1 == TYPE_KEY) {
      this_00 = std::operator<<((ostream *)&std::cout,"[KEY] handling key event");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = EventHandle::onHandleEvent(&this->super_EventHandle,e);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool KeyEventHandle::onHandleEvent(Event* e)
{
	if (!e)
		return false;

	switch (e->getType()) {
	case Event::TYPE_KEY:
		cout<<"[KEY] handling key event"<<endl;
		return true;
	default:
		break;
	}

	return EventHandle::onHandleEvent(e);
}